

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_next(lua_State *L)

{
  int iVar1;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffffc;
  
  luaL_checktype(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  lua_settop(in_RDI,2);
  iVar1 = lua_next(unaff_retaddr,in_stack_fffffffffffffffc);
  if (iVar1 == 0) {
    lua_pushnil(in_RDI);
    iVar1 = 1;
  }
  else {
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static int luaB_next(lua_State*L){
luaL_checktype(L,1,5);
lua_settop(L,2);
if(lua_next(L,1))
return 2;
else{
lua_pushnil(L);
return 1;
}
}